

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::SetTrimBoundingBoxes(ON_Brep *this,ON_BrepLoop *loop,bool bLazy)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  byte local_41;
  byte local_40;
  
  iVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar2 = (loop->m_ti).m_count;
  if ((int)CONCAT71(in_register_00000011,bLazy) != 0) {
    bVar3 = ON_BoundingBox::IsValid(&loop->m_pbox);
    if (bVar3) {
      local_40 = 0;
      goto LAB_00436474;
    }
  }
  ON_BoundingBox::Destroy(&loop->m_pbox);
  local_40 = 1;
LAB_00436474:
  uVar6 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar6;
  }
  local_41 = 1;
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    iVar4 = (loop->m_ti).m_a[uVar6];
    lVar5 = (long)iVar4;
    if ((-1 < lVar5) && (iVar4 < iVar1)) {
      iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])
                        (this,(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                              super_ON_ClassArray<ON_BrepTrim>.m_a + lVar5,(ulong)bLazy);
      if ((local_40 & (byte)iVar4) == 1) {
        ON_BoundingBox::Union
                  (&loop->m_pbox,
                   &(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                    m_a[lVar5].m_pbox);
      }
      else {
        local_41 = local_41 & (byte)iVar4;
      }
    }
  }
  if (local_41 != 0) {
    bVar3 = ON_BoundingBox::IsValid(&loop->m_pbox);
    return bVar3;
  }
  return false;
}

Assistant:

bool ON_Brep::SetTrimBoundingBoxes( ON_BrepLoop& loop, bool bLazy )
{
  // TL_Brep overrides this function and computes much tighter
  // bounding boxes that take trim.m_t[] into account.
  bool rc = true;
  int ti, lti, trim_count = m_T.Count(), lt_count = loop.m_ti.Count();
  bool bSetLoopBox = true;
  if ( bLazy && loop.m_pbox.IsValid() )
    bSetLoopBox = false;
  else
    loop.m_pbox.Destroy();
  for ( lti = 0; lti < lt_count; lti++ )
  {
    ti = loop.m_ti[lti];
    if ( ti >= 0 && ti < trim_count )
    {
      if ( !SetTrimBoundingBox( m_T[ti], bLazy ) )
        rc = false;
      else if ( bSetLoopBox )
        loop.m_pbox.Union( m_T[ti].m_pbox );
    }
  }
  return (rc && loop.m_pbox.IsValid()) ? true : false;
}